

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseBody(TidyDocImpl *doc,Node *body,GetTokenMode mode)

{
  Lexer *pLVar1;
  bool bVar2;
  bool bVar3;
  Bool BVar4;
  int iVar5;
  Bool iswhitenode;
  Bool checkstack;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *body_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  lexer._4_4_ = IgnoreWhitespace;
  bVar3 = true;
  prvTidyBumpObject(doc,body->parent);
LAB_0014f51d:
  do {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            _iswhitenode = prvTidyGetToken(doc,lexer._4_4_);
            if (_iswhitenode == (Node *)0x0) {
              return;
            }
            if ((_iswhitenode->tag != body->tag) || (_iswhitenode->type != StartTag)) break;
            prvTidyReport(doc,body,_iswhitenode,0x235);
            prvTidyFreeNode(doc,_iswhitenode);
          }
          if ((_iswhitenode == (Node *)0x0) ||
             ((_iswhitenode->tag == (Dict *)0x0 || (_iswhitenode->tag->id != TidyTag_HTML)))) break;
          BVar4 = prvTidynodeIsElement(_iswhitenode);
          if ((BVar4 == no) && (pLVar1->seenEndHtml == no)) {
            pLVar1->seenEndHtml = yes;
          }
          else {
            prvTidyReport(doc,body,_iswhitenode,0x235);
          }
          prvTidyFreeNode(doc,_iswhitenode);
        }
        if ((pLVar1->seenEndBody != no) &&
           (((_iswhitenode->type == StartTag || (_iswhitenode->type == EndTag)) ||
            (_iswhitenode->type == StartEndTag)))) {
          prvTidyReport(doc,body,_iswhitenode,0x233);
        }
        if ((_iswhitenode->tag != body->tag) || (_iswhitenode->type != EndTag)) break;
        body->closed = yes;
        TrimSpaces(doc,body);
        prvTidyFreeNode(doc,_iswhitenode);
        pLVar1->seenEndBody = yes;
        lexer._4_4_ = IgnoreWhitespace;
        if (((body->parent != (Node *)0x0) && (body->parent->tag != (Dict *)0x0)) &&
           (body->parent->tag->id == TidyTag_NOFRAMES)) {
          return;
        }
      }
      if ((_iswhitenode != (Node *)0x0) &&
         ((_iswhitenode->tag != (Dict *)0x0 && (_iswhitenode->tag->id == TidyTag_NOFRAMES)))) {
        if (_iswhitenode->type == StartTag) {
          prvTidyInsertNodeAtEnd(body,_iswhitenode);
          prvTidyParseBlock(doc,_iswhitenode,lexer._4_4_);
          goto LAB_0014f51d;
        }
        if ((((_iswhitenode->type == EndTag) && (body->parent != (Node *)0x0)) &&
            (body->parent->tag != (Dict *)0x0)) && (body->parent->tag->id == TidyTag_NOFRAMES)) {
          TrimSpaces(doc,body);
          prvTidyUngetToken(doc);
          return;
        }
      }
      if (((((_iswhitenode != (Node *)0x0) && (_iswhitenode->tag != (Dict *)0x0)) &&
           (_iswhitenode->tag->id == TidyTag_FRAME)) ||
          (((_iswhitenode != (Node *)0x0 && (_iswhitenode->tag != (Dict *)0x0)) &&
           (_iswhitenode->tag->id == TidyTag_FRAMESET)))) &&
         (((body->parent != (Node *)0x0 && (body->parent->tag != (Dict *)0x0)) &&
          (body->parent->tag->id == TidyTag_NOFRAMES)))) {
        TrimSpaces(doc,body);
        prvTidyUngetToken(doc);
        return;
      }
      bVar2 = false;
      BVar4 = prvTidynodeIsText(_iswhitenode);
      if (((BVar4 != no) && (_iswhitenode->end <= _iswhitenode->start + 1)) &&
         (pLVar1->lexbuf[_iswhitenode->start] == ' ')) {
        bVar2 = true;
      }
      BVar4 = InsertMisc(body,_iswhitenode);
    } while (BVar4 != no);
    BVar4 = prvTidynodeIsText(_iswhitenode);
    if (BVar4 != no) {
      if ((bVar2) && (lexer._4_4_ == IgnoreWhitespace)) {
        prvTidyFreeNode(doc,_iswhitenode);
        goto LAB_0014f51d;
      }
      prvTidyConstrainVersion(doc,0xfffffeda);
      if (bVar3) {
        bVar3 = false;
        iVar5 = prvTidyInlineDup(doc,_iswhitenode);
        if (0 < iVar5) goto LAB_0014f51d;
      }
      prvTidyInsertNodeAtEnd(body,_iswhitenode);
      lexer._4_4_ = MixedContent;
      goto LAB_0014f51d;
    }
    if (_iswhitenode->type != DocTypeTag) {
      if ((_iswhitenode->tag == (Dict *)0x0) ||
         (((_iswhitenode != (Node *)0x0 && (_iswhitenode->tag != (Dict *)0x0)) &&
          (_iswhitenode->tag->id == TidyTag_PARAM)))) {
        prvTidyReport(doc,body,_iswhitenode,0x235);
        prvTidyFreeNode(doc,_iswhitenode);
        goto LAB_0014f51d;
      }
      pLVar1->excludeBlocks = no;
      if (((((_iswhitenode != (Node *)0x0) && (_iswhitenode->tag != (Dict *)0x0)) &&
           (_iswhitenode->tag->id == TidyTag_INPUT)) ||
          ((BVar4 = prvTidynodeHasCM(_iswhitenode,8), BVar4 == no &&
           (BVar4 = prvTidynodeHasCM(_iswhitenode,0x10), BVar4 == no)))) &&
         (BVar4 = prvTidyIsHTML5Mode(doc), BVar4 == no)) {
        if ((_iswhitenode->tag->model & 4) == 0) {
          prvTidyReport(doc,body,_iswhitenode,0x27e);
        }
        if ((_iswhitenode->tag->model & 2) != 0) {
          if (((_iswhitenode != (Node *)0x0) && (_iswhitenode->tag != (Dict *)0x0)) &&
             ((_iswhitenode->tag->id == TidyTag_BODY &&
              ((body->implicit != no && (body->attributes == (AttVal *)0x0)))))) {
            body->attributes = _iswhitenode->attributes;
            _iswhitenode->attributes = (AttVal *)0x0;
          }
          prvTidyFreeNode(doc,_iswhitenode);
          goto LAB_0014f51d;
        }
        if ((_iswhitenode->tag->model & 4) != 0) {
          MoveToHead(doc,body,_iswhitenode);
          goto LAB_0014f51d;
        }
        if ((_iswhitenode->tag->model & 0x20) == 0) {
          if ((_iswhitenode->tag->model & 0x40) == 0) {
            if ((_iswhitenode->tag->model & 0x380) == 0) {
              if (((_iswhitenode == (Node *)0x0) || (_iswhitenode->tag == (Dict *)0x0)) ||
                 (_iswhitenode->tag->id != TidyTag_INPUT)) {
                BVar4 = prvTidynodeHasCM(_iswhitenode,0x600);
                if (BVar4 == no) {
                  prvTidyUngetToken(doc);
                  return;
                }
                prvTidyFreeNode(doc,_iswhitenode);
                goto LAB_0014f51d;
              }
              prvTidyUngetToken(doc);
              _iswhitenode = prvTidyInferredTag(doc,TidyTag_FORM);
              pLVar1->excludeBlocks = yes;
            }
            else {
              if (_iswhitenode->type != EndTag) {
                prvTidyUngetToken(doc);
                _iswhitenode = prvTidyInferredTag(doc,TidyTag_TABLE);
              }
              pLVar1->excludeBlocks = yes;
            }
          }
          else {
            prvTidyUngetToken(doc);
            _iswhitenode = prvTidyInferredTag(doc,TidyTag_DL);
            pLVar1->excludeBlocks = yes;
          }
        }
        else {
          prvTidyUngetToken(doc);
          _iswhitenode = prvTidyInferredTag(doc,TidyTag_UL);
          AddClassNoIndent(doc,_iswhitenode);
          pLVar1->excludeBlocks = yes;
        }
      }
      if (_iswhitenode->type == EndTag) {
        if (((_iswhitenode == (Node *)0x0) || (_iswhitenode->tag == (Dict *)0x0)) ||
           (_iswhitenode->tag->id != TidyTag_BR)) {
          if (((_iswhitenode == (Node *)0x0) || (_iswhitenode->tag == (Dict *)0x0)) ||
             (_iswhitenode->tag->id != TidyTag_P)) {
            BVar4 = prvTidynodeHasCM(_iswhitenode,0x10);
            if (BVar4 != no) {
              prvTidyPopInline(doc,_iswhitenode);
            }
          }
          else {
            _iswhitenode->type = StartEndTag;
            _iswhitenode->implicit = yes;
          }
        }
        else {
          _iswhitenode->type = StartTag;
        }
      }
      BVar4 = prvTidynodeIsElement(_iswhitenode);
      if (BVar4 != no) {
        if ((((_iswhitenode != (Node *)0x0) && (_iswhitenode->tag != (Dict *)0x0)) &&
            (_iswhitenode->tag->id == TidyTag_MAIN)) &&
           (BVar4 = prvTidyFindNodeById(doc,TidyTag_MAIN), BVar4 != no)) {
          doc->badForm = doc->badForm | 2;
          prvTidyReport(doc,body,_iswhitenode,0x235);
          prvTidyFreeNode(doc,_iswhitenode);
          goto LAB_0014f51d;
        }
        BVar4 = prvTidynodeHasCM(_iswhitenode,0x10);
        if (BVar4 == no) {
          bVar3 = true;
          lexer._4_4_ = IgnoreWhitespace;
        }
        else {
          if (((_iswhitenode == (Node *)0x0) || (_iswhitenode->tag == (Dict *)0x0)) ||
             (_iswhitenode->tag->id != TidyTag_IMG)) {
            prvTidyConstrainVersion(doc,0xfffffeda);
          }
          else {
            prvTidyConstrainVersion(doc,0xfffffedb);
          }
          if ((bVar3) && (_iswhitenode->implicit == no)) {
            bVar3 = false;
            iVar5 = prvTidyInlineDup(doc,_iswhitenode);
            if (0 < iVar5) goto LAB_0014f51d;
          }
          lexer._4_4_ = MixedContent;
        }
        if (_iswhitenode->implicit != no) {
          prvTidyReport(doc,body,_iswhitenode,0x247);
        }
        prvTidyInsertNodeAtEnd(body,_iswhitenode);
        ParseTag(doc,_iswhitenode,lexer._4_4_);
        goto LAB_0014f51d;
      }
      prvTidyReport(doc,body,_iswhitenode,0x235);
      prvTidyFreeNode(doc,_iswhitenode);
      goto LAB_0014f51d;
    }
    InsertDocType(doc,body,_iswhitenode);
  } while( true );
}

Assistant:

void TY_(ParseBody)(TidyDocImpl* doc, Node *body, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool checkstack, iswhitenode;

    mode = IgnoreWhitespace;
    checkstack = yes;

    TY_(BumpObject)( doc, body->parent );

    DEBUG_LOG(SPRTF("Enter ParseBody...\n"));
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /* find and discard multiple <body> elements */
        if (node->tag == body->tag && node->type == StartTag)
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* #538536 Extra endtags not detected */
        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node) || lexer->seenEndHtml) 
                TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            else
                lexer->seenEndHtml = 1;

            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( lexer->seenEndBody && 
             ( node->type == StartTag ||
               node->type == EndTag   ||
               node->type == StartEndTag ) )
        {
            TY_(Report)(doc, body, node, CONTENT_AFTER_BODY );
        }

        if ( node->tag == body->tag && node->type == EndTag )
        {
            body->closed = yes;
            TrimSpaces(doc, body);
            TY_(FreeNode)( doc, node);
            lexer->seenEndBody = 1;
            mode = IgnoreWhitespace;

            if ( nodeIsNOFRAMES(body->parent) )
                break;

            continue;
        }

        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type == StartTag)
            {
                TY_(InsertNodeAtEnd)(body, node);
                TY_(ParseBlock)(doc, node, mode);
                continue;
            }

            if (node->type == EndTag && nodeIsNOFRAMES(body->parent) )
            {
                TrimSpaces(doc, body);
                TY_(UngetToken)( doc );
                break;
            }
        }

        if ( (nodeIsFRAME(node) || nodeIsFRAMESET(node))
             && nodeIsNOFRAMES(body->parent) )
        {
            TrimSpaces(doc, body);
            TY_(UngetToken)( doc );
            break;
        }
        
        iswhitenode = no;

        if ( TY_(nodeIsText)(node) &&
             node->end <= node->start + 1 &&
             lexer->lexbuf[node->start] == ' ' )
            iswhitenode = yes;

        /* deal with comments etc. */
        if (InsertMisc(body, node))
            continue;

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if (iswhitenode && mode == IgnoreWhitespace)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* HTML 2 and HTML4 strict don't allow text here */
            TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT | VERS_HTML20));

            if (checkstack)
            {
                checkstack = no;

                if ( TY_(InlineDup)(doc, node) > 0 )
                    continue;
            }

            TY_(InsertNodeAtEnd)(body, node);
            mode = MixedContent;
            continue;
        }

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, body, node);
            continue;
        }
        /* discard unknown  and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          Netscape allows LI and DD directly in BODY
          We infer UL or DL respectively and use this
          Bool to exclude block-level elements so as
          to match Netscape's observed behaviour.
        */
        lexer->excludeBlocks = no;
        
        if (( nodeIsINPUT(node) ||
             (!TY_(nodeHasCM)(node, CM_BLOCK) && !TY_(nodeHasCM)(node, CM_INLINE))
           ) && !TY_(IsHTML5Mode)(doc) )
        {
            /* avoid this error message being issued twice */
            if (!(node->tag->model & CM_HEAD))
                TY_(Report)(doc, body, node, TAG_NOT_ALLOWED_IN);

            if (node->tag->model & CM_HTML)
            {
                /* copy body attributes if current body was inferred */
                if ( nodeIsBODY(node) && body->implicit 
                     && body->attributes == NULL )
                {
                    body->attributes = node->attributes;
                    node->attributes = NULL;
                }

                TY_(FreeNode)( doc, node);
                continue;
            }

            if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, body, node);
                continue;
            }

            if (node->tag->model & CM_LIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_UL);
                AddClassNoIndent(doc, node);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & CM_DEFLIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_DL);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & (CM_TABLE | CM_ROWGRP | CM_ROW))
            {
                /* http://tidy.sf.net/issue/2855621 */
                if (node->type != EndTag) {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                lexer->excludeBlocks = yes;
            }
            else if ( nodeIsINPUT(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_FORM);
                lexer->excludeBlocks = yes;
            }
            else
            {
                if ( !TY_(nodeHasCM)(node, CM_ROW | CM_FIELD) )
                {
                    TY_(UngetToken)( doc );
                    return;
                }

                /* ignore </td> </th> <option> etc. */
                TY_(FreeNode)( doc, node );
                continue;
            }
        }

        if (node->type == EndTag)
        {
            if ( nodeIsBR(node) )
                node->type = StartTag;
            else if ( nodeIsP(node) )
            {
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if ( TY_(nodeHasCM)(node, CM_INLINE) )
                TY_(PopInline)( doc, node );
        }

        if (TY_(nodeIsElement)(node))
        {
            if (nodeIsMAIN(node)) {
                /*\ Issue #166 - repeated <main> element
                 *  How to efficiently search for a previous main element?
                \*/
                if ( TY_(FindNodeById)(doc, TidyTag_MAIN) )
                {
                    doc->badForm |= flg_BadMain; /* this is an ERROR in format */
                    TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
            }
            /* Issue #20 - merging from Ger Hobbelt fork put back CM_MIXED, which had been
               removed to fix this issue - reverting to fix 880221e
             */
            if ( TY_(nodeHasCM)(node, CM_INLINE) )
            {
                /* HTML4 strict doesn't allow inline content here */
                /* but HTML2 does allow img elements as children of body */
                if ( nodeIsIMG(node) )
                    TY_(ConstrainVersion)(doc, ~VERS_HTML40_STRICT);
                else
                    TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT|VERS_HTML20));

                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }

                mode = MixedContent;
            }
            else
            {
                checkstack = yes;
                mode = IgnoreWhitespace;
            }

            if (node->implicit)
                TY_(Report)(doc, body, node, INSERTING_TAG);

            TY_(InsertNodeAtEnd)(body, node);
            ParseTag(doc, node, mode);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG(SPRTF("Exit ParseBody 1...\n"));
}